

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffs2c(char *instr,char *outstr,int *status)

{
  int *piVar1;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  char *in_RSI;
  char *in_RDI;
  size_t jj;
  size_t ii;
  size_t len;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  int local_4;
  
  piVar1 = (int *)CONCAT71(in_register_00000011,in_DL);
  if (*piVar1 < 1) {
    if (in_RDI == (char *)0x0) {
      strcpy(in_RSI,"\'\'");
      local_4 = *piVar1;
    }
    else {
      *in_RSI = '\'';
      local_28 = strlen(in_RDI);
      if (0x44 < local_28) {
        local_28 = 0x44;
      }
      local_38 = 1;
      for (local_30 = 0; local_30 < local_28 && local_38 < 0x45; local_30 = local_30 + 1) {
        in_RSI[local_38] = in_RDI[local_30];
        if (in_RDI[local_30] == '\'') {
          local_38 = local_38 + 1;
          in_RSI[local_38] = '\'';
        }
        local_38 = local_38 + 1;
      }
      for (; local_38 < 9; local_38 = local_38 + 1) {
        in_RSI[local_38] = ' ';
      }
      if (local_38 == 0x46) {
        in_RSI[0x45] = '\0';
      }
      else {
        in_RSI[local_38] = '\'';
        in_RSI[local_38 + 1] = '\0';
      }
      local_4 = *piVar1;
    }
  }
  else {
    local_4 = *piVar1;
  }
  return local_4;
}

Assistant:

int ffs2c(const char *instr, /* I - null terminated input string  */
          char *outstr,      /* O - null terminated quoted output string */
          int *status)       /* IO - error status */
/*
  convert an input string to a quoted string. Leading spaces 
  are significant.  FITS string keyword values must be at least 
  8 chars long so pad out string with spaces if necessary.
  (*** This 8 char requirement is now obsolete.  See ffs2c_nopad
  for an alternative ***)
      Example:   km/s ==> 'km/s    '
  Single quote characters in the input string will be replace by
  two single quote characters. e.g., o'brian ==> 'o''brian'
*/
{
    size_t len, ii, jj;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (!instr)            /* a null input pointer?? */
    {
       strcpy(outstr, "''");   /* a null FITS string */
       return(*status);
    }

    outstr[0] = '\'';      /* start output string with a quote */

    len = strlen(instr);
    if (len > 68)
        len = 68;    /* limit input string to 68 chars */

    for (ii=0, jj=1; ii < len && jj < 69; ii++, jj++)
    {
        outstr[jj] = instr[ii];  /* copy each char from input to output */
        if (instr[ii] == '\'')
        {
            jj++;
            outstr[jj]='\'';   /* duplicate any apostrophies in the input */
        }
    }

    for (; jj < 9; jj++)       /* pad string so it is at least 8 chars long */
        outstr[jj] = ' ';

    if (jj == 70)   /* only occurs if the last char of string was a quote */
        outstr[69] = '\0';
    else
    {
        outstr[jj] = '\'';         /* append closing quote character */
        outstr[jj+1] = '\0';          /* terminate the string */
    }

    return(*status);
}